

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

void __thiscall lts2::LBDOperator::recordBasisMovie(LBDOperator *this,string *movieName)

{
  undefined4 uVar1;
  _InputArray *p_Var2;
  int iVar3;
  int i;
  uint idx;
  Scalar_<double> local_1d0;
  double bmax;
  double bmin;
  Size local_1a0;
  _InputArray local_198;
  Size local_180;
  VideoWriter movie;
  Mat basisImage;
  Mat grayFrame;
  Mat currrentFrame;
  
  uVar1 = cv::VideoWriter::fourcc('m','p','4','v');
  local_180 = this->_patchSize;
  cv::VideoWriter::VideoWriter((VideoWriter *)0x4000000000000000,&movie,movieName,uVar1);
  cv::Mat::Mat(&currrentFrame);
  cv::Mat::Mat(&grayFrame);
  local_1a0 = this->_patchSize;
  cv::Scalar_<double>::Scalar_(&local_1d0,0.0);
  cv::Mat::Mat(&basisImage,&local_1a0,5);
  for (idx = 0; idx < *(uint *)&(this->super_LinearOperator).field_0xc; idx = idx + 1) {
    fillBasisFunctionForIndex(this,&basisImage,idx);
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&basisImage;
    p_Var2 = (_InputArray *)cv::noArray();
    iVar3 = 0;
    cv::minMaxLoc((_InputArray *)&local_1d0,&bmin,&bmax,(Point_ *)0x0,(Point_ *)0x0,p_Var2);
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x2010000;
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&grayFrame;
    cv::Mat::convertTo((_OutputArray *)&basisImage,(int)(_InputArray *)&local_1d0,
                       255.0 / (bmax - bmin),(bmin * -255.0) / (bmax - bmin));
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
    local_198.sz.width = 0;
    local_198.sz.height = 0;
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
    local_198.flags = 0x2010000;
    local_1d0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&grayFrame;
    local_198.obj = &currrentFrame;
    cv::cvtColor((cv *)&local_1d0,&local_198,(_OutputArray *)0x8,0,iVar3);
    cv::VideoWriter::operator<<(&movie,&currrentFrame);
  }
  cv::Mat::~Mat(&basisImage);
  cv::Mat::~Mat(&grayFrame);
  cv::Mat::~Mat(&currrentFrame);
  cv::VideoWriter::~VideoWriter(&movie);
  return;
}

Assistant:

void lts2::LBDOperator::recordBasisMovie(std::string const& movieName)
{
  cv::VideoWriter movie(movieName, cv::VideoWriter::fourcc('m', 'p', '4', 'v'), 2.0, _patchSize);
    
    cv::Mat currrentFrame, grayFrame;
    cv::Mat basisImage(_patchSize, CV_32F, cv::Scalar(0));
    
    double bmin, bmax;
    
    for (int i = 0; i < _pairsInUse; ++i)
    {
        // Fill basis image
        fillBasisFunctionForIndex(basisImage, i);
        cv::minMaxLoc(basisImage, &bmin, &bmax);
        
        // Convert to uchar
        basisImage.convertTo(grayFrame, CV_8U, 255.0/(bmax-bmin), -255.0*bmin/(bmax-bmin));
        
        // Color
        cv::cvtColor(grayFrame, currrentFrame, cv::COLOR_GRAY2BGR);
        
        movie << currrentFrame;
    }
}